

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

JavascriptArray *
Js::JavascriptArray::BoxStackInstance<Js::JavascriptArray>(JavascriptArray *instance,bool deepCopy)

{
  code *pcVar1;
  size_t sVar2;
  bool bVar3;
  undefined4 *puVar4;
  DynamicTypeHandler *this;
  SparseArraySegmentBase **ppSVar5;
  Recycler *pRVar6;
  SparseArraySegmentBase *pSVar7;
  JavascriptArray *pJVar8;
  TrackAllocData local_d0;
  code *local_a8;
  undefined8 local_a0;
  TrackAllocData local_98;
  code *local_70;
  undefined8 local_68;
  TrackAllocData local_60;
  size_t local_38;
  size_t inlineSlotsSize;
  JavascriptArray **boxedInstanceRef;
  JavascriptArray *boxedInstance;
  JavascriptArray *pJStack_18;
  bool deepCopy_local;
  JavascriptArray *instance_local;
  
  boxedInstance._7_1_ = deepCopy;
  pJStack_18 = instance;
  bVar3 = ThreadContext::IsOnStack(instance);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2f6d,"(ThreadContext::IsOnStack(instance))",
                                "ThreadContext::IsOnStack(instance)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((boxedInstance._7_1_ & 1) == 0) {
    inlineSlotsSize = (size_t)&pJStack_18[-1].segmentUnion;
    if (*(Type *)inlineSlotsSize != (Type)0x0) {
      return (JavascriptArray *)*(Type *)inlineSlotsSize;
    }
  }
  else {
    inlineSlotsSize = 0;
  }
  boxedInstanceRef = (JavascriptArray **)0x0;
  this = DynamicObject::GetTypeHandler((DynamicObject *)pJStack_18);
  local_38 = DynamicTypeHandler::GetInlineSlotsSize(this);
  ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&pJStack_18->head);
  bVar3 = ThreadContext::IsOnStack(*ppSVar5);
  if ((bVar3) || ((boxedInstance._7_1_ & 1) != 0)) {
    if ((boxedInstance._7_1_ & 1) == 0) {
      pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)pJStack_18);
      sVar2 = local_38;
      pSVar7 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pJStack_18->head);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_60,(type_info *)&typeinfo,sVar2 + 0x18 + (ulong)pSVar7->size * 8,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                 ,0x2f90);
      pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_60);
      Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pJStack_18->head);
      local_70 = Memory::Recycler::AllocZero;
      local_68 = 0;
      pJVar8 = (JavascriptArray *)new<Memory::Recycler>(0x38,pRVar6,0x473830,0);
      JavascriptArray(pJVar8,pJStack_18,true,false);
      boxedInstanceRef = (JavascriptArray **)pJVar8;
    }
    else {
      boxedInstanceRef = (JavascriptArray **)DeepCopyInstance<Js::JavascriptArray>(pJStack_18);
    }
  }
  else if (local_38 == 0) {
    pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)pJStack_18);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_d0,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
               ,0x2f99);
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_d0);
    pJVar8 = (JavascriptArray *)new<Memory::Recycler>(0x38,pRVar6,0x43c4b0);
    JavascriptArray(pJVar8,pJStack_18,false,false);
    boxedInstanceRef = (JavascriptArray **)pJVar8;
  }
  else {
    pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)pJStack_18);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_98,(type_info *)&typeinfo,local_38,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
               ,0x2f95);
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_98);
    local_a8 = Memory::Recycler::AllocZero;
    local_a0 = 0;
    pJVar8 = (JavascriptArray *)new<Memory::Recycler>(0x38,pRVar6,0x473830,0);
    JavascriptArray(pJVar8,pJStack_18,false,false);
    boxedInstanceRef = (JavascriptArray **)pJVar8;
  }
  if (inlineSlotsSize != 0) {
    *(JavascriptArray ***)inlineSlotsSize = boxedInstanceRef;
  }
  return (JavascriptArray *)boxedInstanceRef;
}

Assistant:

T * JavascriptArray::BoxStackInstance(T * instance, bool deepCopy)
    {
        Assert(ThreadContext::IsOnStack(instance));
        T * boxedInstance;
        T ** boxedInstanceRef;
        if (!deepCopy)
        {
            // On the stack, the we reserved a pointer before the object as to store the boxed value
            boxedInstanceRef = ((T **)instance) - 1;
            boxedInstance = *boxedInstanceRef;
            if (boxedInstance)
            {
                return boxedInstance;
            }
        }
        else
        {
            // When doing a deep copy, do not cache the boxed value to ensure that only shallow copies
            // are reused
            boxedInstance = nullptr;
            boxedInstanceRef = nullptr;
        }

        const size_t inlineSlotsSize = instance->GetTypeHandler()->GetInlineSlotsSize();
        if (ThreadContext::IsOnStack(instance->head) || deepCopy)
        {
            // Reallocate both the object as well as the head segment when the head is on the stack or
            // when a deep copy is needed. This is to prevent a scenario where box may leave either one
            // on the stack when both must be on the heap.
            if (deepCopy)
            {
                boxedInstance = DeepCopyInstance(instance);
            }
            else
            {
                boxedInstance = RecyclerNewPlusZ(instance->GetRecycler(),
                    inlineSlotsSize + sizeof(Js::SparseArraySegmentBase) + instance->head->size * sizeof(typename T::TElement),
                    T, instance, true /*boxHead*/, false /*deepCopy*/);
            }
        }
        else if(inlineSlotsSize)
        {
            boxedInstance = RecyclerNewPlusZ(instance->GetRecycler(), inlineSlotsSize, T, instance, false, false);
        }
        else
        {
            boxedInstance = RecyclerNew(instance->GetRecycler(), T, instance, false, false);
        }

        if (boxedInstanceRef != nullptr)
        {
            *boxedInstanceRef = boxedInstance;
        }
        return boxedInstance;
    }